

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O0

am_loc_values * create_loc_values(Am_Inter_Location *current_loc,Am_Value *old_val)

{
  bool bVar1;
  am_loc_values *paVar2;
  ostream *poVar3;
  void *pvVar4;
  Am_Inter_Location local_68;
  Am_Inter_Location old_loc;
  Am_Object oref_obj;
  int od;
  int oc;
  int ob;
  int oa;
  Am_Object ref_obj;
  int d;
  int c;
  int b;
  int a;
  bool as_line;
  am_loc_values *local_20;
  am_loc_values *ret;
  Am_Value *old_val_local;
  Am_Inter_Location *current_loc_local;
  
  ret = (am_loc_values *)old_val;
  old_val_local = (Am_Value *)current_loc;
  paVar2 = (am_loc_values *)operator_new(0x60);
  am_loc_values::am_loc_values(paVar2);
  local_20 = paVar2;
  Am_Object::Am_Object((Am_Object *)&ob);
  Am_Inter_Location::Get_Location
            ((Am_Inter_Location *)old_val_local,(bool *)((long)&b + 3),(Am_Object *)&ob,&c,&d,
             (int *)((long)&ref_obj.data + 4),(int *)&ref_obj);
  if ((b._3_1_ & 1) == 0) {
    Am_Inter_Location::operator=(&local_20->orig_value,(Am_Inter_Location *)old_val_local);
    bVar1 = Am_Inter_Location::Get_Growing((Am_Inter_Location *)old_val_local);
    local_20->growing = bVar1;
    local_20->left_equals = c;
    local_20->top_equals = d;
    local_20->width_equals = ref_obj.data._4_4_;
    local_20->height_equals = (int)ref_obj.data;
    bVar1 = Am_Value::Valid((Am_Value *)ret);
    if (bVar1) {
      bVar1 = Am_Inter_Location::Test((Am_Value *)ret);
      if (bVar1) {
        Am_Object::Am_Object((Am_Object *)&old_loc);
        Am_Inter_Location::Am_Inter_Location(&local_68,(Am_Value *)ret);
        Am_Inter_Location::Get_Location
                  (&local_68,(bool *)((long)&b + 3),(Am_Object *)&old_loc,&oc,&od,
                   (int *)((long)&oref_obj.data + 4),(int *)&oref_obj);
        if ((b._3_1_ & 1) == 0) {
          bVar1 = Am_Object::operator!=((Am_Object *)&old_loc,(Am_Object *)&ob);
          if (bVar1) {
            Am_Translate_Coordinates((Am_Object *)&old_loc,oc,od,(Am_Object *)&ob,&oc,&od);
          }
          local_20->left_offset = c - oc;
          local_20->top_offset = d - od;
          local_20->width_offset = ref_obj.data._4_4_ - oref_obj.data._4_4_;
          local_20->height_offset = (int)ref_obj.data - (int)oref_obj.data;
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,"**old value is as line ");
          poVar3 = operator<<(poVar3,&local_68);
          pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
        }
        Am_Inter_Location::~Am_Inter_Location(&local_68);
        Am_Object::~Am_Object((Am_Object *)&old_loc);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"**Old val not an inter location ");
        poVar3 = operator<<(poVar3,(Am_Value *)ret);
        pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
      }
    }
    paVar2 = local_20;
    Am_Object::~Am_Object((Am_Object *)&ob);
    return paVar2;
  }
  Am_Error("Shouldn\'t be as_line");
}

Assistant:

am_loc_values *
create_loc_values(Am_Inter_Location &current_loc, Am_Value &old_val)
{
  am_loc_values *ret = new am_loc_values();
  bool as_line;
  int a, b, c, d;
  Am_Object ref_obj;
  current_loc.Get_Location(as_line, ref_obj, a, b, c, d);
  if (as_line)
    Am_Error("Shouldn't be as_line");
  ret->orig_value = current_loc;
  ret->growing = current_loc.Get_Growing();
  ret->left_equals = a;
  ret->top_equals = b;
  ret->width_equals = c;
  ret->height_equals = d;
  if (old_val.Valid()) {
    if (Am_Inter_Location::Test(old_val)) {
      int oa, ob, oc, od;
      Am_Object oref_obj;
      Am_Inter_Location old_loc = old_val;
      old_loc.Get_Location(as_line, oref_obj, oa, ob, oc, od);
      if (as_line) {
        std::cout << "**old value is as line " << old_loc << std::endl
                  << std::flush;
      } else {
        if (oref_obj != ref_obj)
          Am_Translate_Coordinates(oref_obj, oa, ob, ref_obj, oa, ob);
        ret->left_offset = a - oa;
        ret->top_offset = b - ob;
        ret->width_offset = c - oc;
        ret->height_offset = d - od;
      }
    } else {
      std::cout << "**Old val not an inter location " << old_val << std::endl
                << std::flush;
    }
  }
  return ret;
}